

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

char * __thiscall cmCPackIFWGenerator::GetPackagingInstallPrefix(cmCPackIFWGenerator *this)

{
  bool bVar1;
  char *pcVar2;
  char *local_110;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator local_39;
  string local_38 [8];
  string tmpPref;
  char *defPrefix;
  cmCPackIFWGenerator *this_local;
  
  tmpPref.field_2._8_8_ = cmCPackGenerator::GetPackagingInstallPrefix(&this->super_cmCPackGenerator)
  ;
  local_110 = (char *)tmpPref.field_2._8_8_;
  if ((char *)tmpPref.field_2._8_8_ == (char *)0x0) {
    local_110 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,local_110,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
          ::empty(&(this->super_cmCPackGenerator).Components);
  if (bVar1) {
    GetRootPackageName_abi_cxx11_(&local_b0,this);
    std::operator+(&local_90,"packages/",&local_b0);
    std::operator+(&local_70,&local_90,"/data");
    std::__cxx11::string::operator+=(local_38,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"CPACK_IFW_PACKAGING_INSTALL_PREFIX",&local_d1);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_d0,pcVar2);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"CPACK_IFW_PACKAGING_INSTALL_PREFIX",&local_f9);
  pcVar2 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string(local_38);
  return pcVar2;
}

Assistant:

const char* cmCPackIFWGenerator::GetPackagingInstallPrefix()
{
  const char* defPrefix = this->cmCPackGenerator::GetPackagingInstallPrefix();

  std::string tmpPref = defPrefix ? defPrefix : "";

  if (this->Components.empty()) {
    tmpPref += "packages/" + this->GetRootPackageName() + "/data";
  }

  this->SetOption("CPACK_IFW_PACKAGING_INSTALL_PREFIX", tmpPref.c_str());

  return this->GetOption("CPACK_IFW_PACKAGING_INSTALL_PREFIX");
}